

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void ubidi_addPropertyStarts_63(USetAdder *sa,UErrorCode *pErrorCode)

{
  uint8_t uVar1;
  bool bVar2;
  bool bVar3;
  uint8_t uVar4;
  uint uVar5;
  uint uVar6;
  uint8_t *puVar7;
  long lVar8;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return;
  }
  lVar8 = 0;
  utrie2_enum_63(&ubidi_props_singleton.trie,(UTrie2EnumValue *)0x0,_enumPropertyStartsRange,sa);
  do {
    uVar6 = *(uint *)((long)ubidi_props_mirrors + lVar8) & 0x1fffff;
    (*(code *)sa->addRange)(sa->set,uVar6,uVar6 + 1);
    lVar8 = lVar8 + 4;
  } while (lVar8 != 0xa0);
  puVar7 = "-";
  uVar5 = 0x8c0;
  uVar6 = 0x620;
  bVar3 = true;
  do {
    bVar2 = bVar3;
    if (uVar6 < uVar5) {
      lVar8 = 0;
      uVar4 = '\0';
      do {
        uVar1 = puVar7[lVar8];
        if (uVar1 != uVar4) {
          (*(code *)sa->add)(sa->set,(ulong)uVar6 + lVar8);
          uVar4 = uVar1;
        }
        lVar8 = lVar8 + 1;
      } while ((ulong)((uVar5 - uVar6) - 4) + 4 != lVar8);
      if (uVar4 != '\0') {
        (*(code *)sa->add)(sa->set,uVar5);
      }
    }
    puVar7 = ":<<@@=";
    uVar5 = 0x10d24;
    uVar6 = 0x10ac0;
    bVar3 = false;
  } while (bVar2);
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }